

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O0

int Abc_NodeResubMffc(Abc_ManRst_t *p,Vec_Ptr_t *vDecs,int nLeaves,Abc_Obj_t *pRoot)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  void *Entry;
  int local_3c;
  int local_38;
  int k;
  int i;
  int Counter;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pRoot_local;
  int nLeaves_local;
  Vec_Ptr_t *vDecs_local;
  Abc_ManRst_t *p_local;
  
  Abc_NtkIncrementTravId(pRoot->pNtk);
  for (local_38 = 0; local_38 < nLeaves; local_38 = local_38 + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vDecs,local_38);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  iVar1 = Abc_NodeIsTravIdPrevious(pRoot);
  if (iVar1 == 0) {
    __assert_fail("Abc_NodeIsTravIdPrevious(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x497,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
  }
  iVar1 = Abc_NodeResubMffc_rec(pRoot);
  Vec_PtrClear(p->vTemp);
  local_3c = 0;
  for (local_38 = nLeaves; iVar2 = Vec_PtrSize(vDecs), local_38 < iVar2; local_38 = local_38 + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vDecs,local_38);
    iVar2 = Abc_NodeIsTravIdCurrent(pAVar3);
    if (iVar2 == 0) {
      Vec_PtrWriteEntry(vDecs,local_3c,pAVar3);
      local_3c = local_3c + 1;
    }
    else {
      Vec_PtrPush(p->vTemp,pAVar3);
    }
  }
  for (local_38 = 0; iVar2 = Vec_PtrSize(p->vTemp), local_38 < iVar2; local_38 = local_38 + 1) {
    Entry = Vec_PtrEntry(p->vTemp,local_38);
    Vec_PtrWriteEntry(vDecs,local_3c,Entry);
    local_3c = local_3c + 1;
  }
  iVar2 = Vec_PtrSize(p->vDecs);
  if (local_3c != iVar2) {
    __assert_fail("k == Vec_PtrSize(p->vDecs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x4a4,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
  }
  pAVar3 = (Abc_Obj_t *)Vec_PtrEntryLast(p->vDecs);
  if (pRoot != pAVar3) {
    __assert_fail("pRoot == Vec_PtrEntryLast(p->vDecs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x4a5,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
  }
  return iVar1;
}

Assistant:

int Abc_NodeResubMffc( Abc_ManRst_t * p, Vec_Ptr_t * vDecs, int nLeaves, Abc_Obj_t * pRoot )
{
    Abc_Obj_t * pObj;
    int Counter, i, k;
    // increment the traversal ID for the leaves
    Abc_NtkIncrementTravId( pRoot->pNtk );
    // label the leaves
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vDecs, pObj, i, nLeaves )
        Abc_NodeSetTravIdCurrent( pObj ); 
    // make sure the node is in the cone and is no one of the leaves
    assert( Abc_NodeIsTravIdPrevious(pRoot) );
    Counter = Abc_NodeResubMffc_rec( pRoot );
    // move the labeled nodes to the end 
    Vec_PtrClear( p->vTemp );
    k = 0;
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vDecs, pObj, i, nLeaves )
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            Vec_PtrPush( p->vTemp, pObj );
        else
            Vec_PtrWriteEntry( vDecs, k++, pObj );
    // add the labeled nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vTemp, pObj, i )
        Vec_PtrWriteEntry( vDecs, k++, pObj );
    assert( k == Vec_PtrSize(p->vDecs) );
    assert( pRoot == Vec_PtrEntryLast(p->vDecs) );
    return Counter;
}